

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers_iterator.hpp
# Opt level: O0

void __thiscall
asio::buffers_iterator<asio::const_buffers_1,_char>::buffers_iterator
          (buffers_iterator<asio::const_buffers_1,_char> *this)

{
  const_buffer *in_RDI;
  
  const_buffer::const_buffer(in_RDI);
  in_RDI[1].data_ = (void *)0x0;
  in_RDI[1].size_ = 0;
  in_RDI[2].data_ = (void *)0x0;
  in_RDI[2].size_ = 0;
  in_RDI[3].data_ = (void *)0x0;
  return;
}

Assistant:

buffers_iterator()
    : current_buffer_(),
      current_buffer_position_(0),
      begin_(),
      current_(),
      end_(),
      position_(0)
  {
  }